

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

void * lws_protocol_vh_priv_zalloc(lws_vhost *vhost,lws_protocols *prot,int size)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  lws_protocols *plVar4;
  void *pvVar5;
  ulong uVar6;
  
  if (((prot == (lws_protocols *)0x0 || vhost == (lws_vhost *)0x0) ||
      (vhost->protocols == (lws_protocols *)0x0)) || (prot->name == (char *)0x0)) {
LAB_001141c5:
    pvVar5 = (void *)0x0;
  }
  else {
    if (vhost->protocol_vh_privs == (void **)0x0) {
      ppvVar3 = (void **)lws_zalloc((long)vhost->count_protocols << 3,"protocol_vh_privs");
      vhost->protocol_vh_privs = ppvVar3;
      if (ppvVar3 == (void **)0x0) goto LAB_001141c5;
    }
    uVar1 = vhost->count_protocols;
    if ((int)uVar1 < 1) {
      uVar6 = 0;
    }
    else {
      plVar4 = vhost->protocols + -1;
      uVar6 = 0;
      do {
        plVar4 = plVar4 + 1;
        if (plVar4 == prot) goto LAB_001141dd;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      uVar6 = (ulong)uVar1;
    }
LAB_001141dd:
    if ((uint)uVar6 == uVar1) {
      if ((int)uVar1 < 1) {
        uVar6 = 0;
      }
      else {
        plVar4 = vhost->protocols;
        uVar6 = 0;
        do {
          if ((plVar4->name != (char *)0x0) && (iVar2 = strcmp(plVar4->name,prot->name), iVar2 == 0)
             ) goto LAB_0011421a;
          uVar6 = uVar6 + 1;
          plVar4 = plVar4 + 1;
        } while (uVar1 != uVar6);
        uVar6 = (ulong)uVar1;
      }
LAB_0011421a:
      if ((uint)uVar6 == uVar1) {
        _lws_log_cx((vhost->lc).log_cx,lws_log_prepend_vhost,vhost,1,"lws_protocol_vh_priv_zalloc",
                    "unknown protocol %p",prot);
        return (void *)0x0;
      }
    }
    pvVar5 = lws_zalloc((long)size,"vh priv");
    vhost->protocol_vh_privs[uVar6 & 0xffffffff] = pvVar5;
    pvVar5 = vhost->protocol_vh_privs[uVar6 & 0xffffffff];
  }
  return pvVar5;
}

Assistant:

void *
lws_protocol_vh_priv_zalloc(struct lws_vhost *vhost,
			    const struct lws_protocols *prot, int size)
{
	int n = 0;

	if (!vhost || !prot || !vhost->protocols || !prot->name)
		return NULL;

	/* allocate the vh priv array only on demand */
	if (!vhost->protocol_vh_privs) {
		vhost->protocol_vh_privs = (void **)lws_zalloc(
				(size_t)vhost->count_protocols * sizeof(void *),
				"protocol_vh_privs");

		if (!vhost->protocol_vh_privs)
			return NULL;
	}

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols) {
			if (vhost->protocols[n].name &&
			    !strcmp(vhost->protocols[n].name, prot->name))
				break;
			n++;
		}

		if (n == vhost->count_protocols) {
			lwsl_vhost_err(vhost, "unknown protocol %p", prot);
			return NULL;
		}
	}

	vhost->protocol_vh_privs[n] = lws_zalloc((size_t)size, "vh priv");
	return vhost->protocol_vh_privs[n];
}